

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppPrinter.cpp
# Opt level: O0

CppPrinter * __thiscall hdc::CppPrinter::print_abi_cxx11_(CppPrinter *this)

{
  string local_38 [40];
  CppPrinter *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::str();
  std::operator<<((ostream *)&std::cout,local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::stringstream::str();
  return this;
}

Assistant:

std::string CppPrinter::print() {
    std::cout << output.str();
    return output.str();
}